

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

void __thiscall amrex::BoxList::BoxList(BoxList *this,Box *bx,int nboxes)

{
  (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->btype).itype = (bx->btype).itype;
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::resize
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)this,(long)nboxes);
  anon_unknown_23::chop_boxes
            ((this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start,bx,nboxes);
  return;
}

Assistant:

BoxList::BoxList (const Box& bx, int nboxes)
    : btype(bx.ixType())
{
    AMREX_ASSERT(nboxes > 0);
    AMREX_ASSERT(bx.numPts() >= nboxes);

    m_lbox.resize(nboxes);
    chop_boxes(m_lbox.data(), bx, nboxes);
}